

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

charcount_t __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::UpdateLine
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,int32 *line,EncodedCharPtr start,
          EncodedCharPtr last,charcount_t ichStart,charcount_t ichEnd)

{
  OLECHAR OVar1;
  charcount_t cVar2;
  uint uVar3;
  charcount_t local_44;
  int local_40;
  charcount_t lastStart;
  int32 current;
  charcount_t ich;
  EncodedCharPtr p;
  charcount_t ichEnd_local;
  charcount_t ichStart_local;
  EncodedCharPtr last_local;
  EncodedCharPtr start_local;
  int32 *line_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  local_40 = *line;
  local_44 = ichStart;
  lastStart = ichStart;
  _current = start;
  p._0_4_ = ichEnd;
  p._4_4_ = ichStart;
  _ichEnd_local = last;
  last_local = start;
  start_local = (EncodedCharPtr)line;
  line_local = (int32 *)this;
  while (lastStart < (charcount_t)p) {
    cVar2 = lastStart + 1;
    OVar1 = UTF8EncodingPolicyBase<false>::ReadFull<false>
                      (&this->super_UTF8EncodingPolicyBase<false>,(EncodedCharPtr *)&current,
                       _ichEnd_local);
    uVar3 = (uint)(ushort)OVar1;
    if (OVar1 == L'\0') break;
    if (uVar3 == 10) goto LAB_015f008b;
    if (uVar3 == 0xd) {
      OVar1 = UTF8EncodingPolicyBase<false>::PeekFull
                        (&this->super_UTF8EncodingPolicyBase<false>,_current,_ichEnd_local);
      if (OVar1 == L'\n') {
        UTF8EncodingPolicyBase<false>::ReadFull<false>
                  (&this->super_UTF8EncodingPolicyBase<false>,(EncodedCharPtr *)&current,
                   _ichEnd_local);
        cVar2 = lastStart + 2;
      }
      goto LAB_015f008b;
    }
    lastStart = cVar2;
    if (uVar3 - 0x2028 < 2) {
LAB_015f008b:
      lastStart = cVar2;
      local_40 = local_40 + 1;
      local_44 = lastStart;
    }
  }
  *(int *)start_local = local_40;
  return local_44;
}

Assistant:

charcount_t Scanner<EncodingPolicy>::UpdateLine(int32 &line, EncodedCharPtr start, EncodedCharPtr last, charcount_t ichStart, charcount_t ichEnd)
{
    EncodedCharPtr p = start;
    charcount_t ich = ichStart;
    int32 current = line;
    charcount_t lastStart = ichStart;

    while (ich < ichEnd)
    {
        ich++;
        switch (this->template ReadFull<false>(p, last))
        {
        case kchRET:
            if (this->PeekFull(p, last) == kchNWL)
            {
                ich++;
                this->template ReadFull<false>(p, last);
            }
            // fall-through

        case kchNWL:
        case kchLS:
        case kchPS:
            current++;
            lastStart = ich;
            break;

        case kchNUL:
            goto done;
        }
    }

done:
    line = current;
    return lastStart;
}